

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delta_mergable.cpp
# Opt level: O2

ostream * cpp_client::operator<<(ostream *out,Delta_mergable *obj)

{
  ostream *poVar1;
  __node_base *p_Var2;
  
  p_Var2 = &(obj->variables_->_M_h)._M_before_begin;
  while (p_Var2 = p_Var2->_M_nxt, p_Var2 != (__node_base *)0x0) {
    poVar1 = std::operator<<(out,(string *)(p_Var2 + 1));
    poVar1 = std::operator<<(poVar1,": ");
    poVar1 = operator<<(poVar1,(Any *)(p_Var2 + 5));
    std::operator<<(poVar1,'\n');
  }
  return out;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const Delta_mergable& obj)
{
   for(const auto& var : obj.variables_)
   {
      out << var.first << ": " << var.second << '\n';
   }
   return out;
}